

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.hpp
# Opt level: O3

string * __thiscall cinatra::uri_t::get_port_abi_cxx11_(string *__return_storage_ptr__,uri_t *this)

{
  size_t sVar1;
  char *pcVar2;
  size_type __len2;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  sVar1 = (this->port)._M_len;
  if (this->is_ssl == true) {
    if (sVar1 != 0) {
      pcVar2 = (this->port)._M_str;
      local_38[0] = local_28;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_38,pcVar2,pcVar2 + sVar1);
      get_port_abi_cxx11_();
      return __return_storage_ptr__;
    }
    __len2 = 3;
    pcVar2 = "http://www.baidu.com:443";
  }
  else {
    if (sVar1 != 0) {
      pcVar2 = (this->port)._M_str;
      local_38[0] = local_28;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_38,pcVar2,pcVar2 + sVar1);
      get_port_abi_cxx11_();
      return __return_storage_ptr__;
    }
    __len2 = 2;
    pcVar2 = "http://www.baidu.com:80";
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (__return_storage_ptr__,0,0,pcVar2 + 0x15,__len2);
  return __return_storage_ptr__;
}

Assistant:

std::string get_port() const {
    std::string port_str;
    if (is_ssl) {
      if (port.empty()) {
        port_str = "443";
      }
      else {
        port_str = std::string(port);
      }
    }
    else {
      if (port.empty()) {
        port_str = "80";
      }
      else {
        port_str = std::string(port);
      }
    }

    return port_str;
  }